

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O3

bool __thiscall
SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse
          (Parse<SGParser::Generator::RegExprNFAParseElement> *this,
          ParseHandler<SGParser::Generator::RegExprNFAParseElement> *parseHandler)

{
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken> *this_00;
  TokenType *token;
  ReduceProduction RVar1;
  pointer pRVar2;
  RegExprNFAParseElement *pRVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  const_iterator cVar8;
  size_t sVar9;
  TokenType TVar10;
  ulong uVar11;
  size_t streamLength;
  ParseTable *pPVar12;
  long lVar13;
  uint left;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  int local_78;
  TokenType local_60;
  TokenType tmpToken;
  TokenCode local_34;
  
  uVar5 = this->TopState;
  if (uVar5 == 0xffffffff) {
    return false;
  }
  token = &this->Token;
  this_00 = &this->Stream;
  tmpToken = (TokenType)&this->ErrorMarker;
LAB_0013ec87:
  this->pStack[this->StackPosition].super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
  State = uVar5;
  if (this->NextTokenFlag != true) goto LAB_0013ecb0;
LAB_0013eca5:
  do {
    BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetNextToken(this_00,token);
LAB_0013ecb0:
    while (uVar5 = ParseTable::GetAction
                             (this->pParseTable,
                              this->pStack[this->StackPosition].
                              super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                              (this->Token).super_TokenCode.Code), -1 < (short)uVar5) {
      uVar6 = 0;
      if ((uVar5 >> 0xe & 1) == 0) {
LAB_0013ef01:
        local_34.Code = uVar6;
        bVar4 = AdvancedInput(this);
        if ((bVar4) ||
           (sVar9 = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::
                    GetBufferedLength(this_00,*(size_t *)tmpToken), sVar9 == 0)) {
          if (*(size_t *)tmpToken != 0xffffffffffffffff) {
            BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ReleaseMarker
                      (this_00,*(size_t *)tmpToken);
          }
          uVar11 = (this->Stream).ThisPos;
          if (0x1ff < uVar11) goto LAB_0013f3eb;
          sVar9 = (uVar11 + ((this->Stream).pThisBlock)->Index) - 1;
          this->ErrorMarker = sVar9;
          BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker(this_00,sVar9);
        }
        uVar11 = this->pParseTable->ActionWidth;
        if (uVar11 != 0) {
          memset(this->pValidTokenStackPositions,0xff,uVar11 * 8);
        }
        uVar15 = this->StackPosition;
        uVar16 = 0;
        bVar4 = false;
        do {
          sVar9 = uVar15 - uVar16;
          uVar5 = ParseTable::GetAction
                            (this->pParseTable,
                             this->pStack[sVar9].
                             super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                             local_34.Code);
          sVar14 = sVar9;
          if ((uVar5 & 0xc000) != 0) {
            while (uVar6 = uVar5 & 0x3fff, (uVar5 >> 0xe & 1) != 0) {
              uVar5 = ParseTable::GetReduceActionPopSize(this->pParseTable,uVar6);
              if (uVar5 == 0) goto LAB_0013f06c;
              sVar14 = sVar14 - (uVar5 - 1);
              if (this->StackSize <= sVar14 - 1) {
                __assert_fail("pos > 0u && pos <= StackSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                              ,599,
                              "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                             );
              }
              uVar5 = ParseTable::GetReduceState
                                (this->pParseTable,
                                 this->pStack[sVar14 - 1].
                                 super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                                 State,uVar6);
              if (uVar5 == 0xffffffff) goto LAB_0013f06c;
              uVar5 = ParseTable::GetAction(this->pParseTable,uVar5,local_34.Code);
            }
            uVar5 = ParseTable::GetAction
                              (this->pParseTable,uVar6,(this->Token).super_TokenCode.Code);
            if ((uVar5 & 0xc000) != 0) {
              uVar5 = ParseTable::GetAction
                                (this->pParseTable,
                                 this->pStack[this->StackPosition].
                                 super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                                 State,local_34.Code);
              if ((uVar5 >> 0xe & 1) != 0) goto LAB_0013f1c2;
              goto LAB_0013f1bd;
            }
LAB_0013f06c:
            bVar4 = true;
            local_78 = (int)uVar11;
            if (local_78 != 0) {
              uVar15 = 0;
              do {
                if ((this->pValidTokenStackPositions[uVar15] == 0xffffffffffffffff) &&
                   (uVar5 = ParseTable::GetAction(this->pParseTable,uVar6,(uint)uVar15),
                   (uVar5 & 0xc000) != 0)) {
                  this->pValidTokenStackPositions[uVar15] = sVar9;
                }
                uVar15 = uVar15 + 1;
              } while ((uVar11 & 0xffffffff) != uVar15);
            }
          }
          uVar16 = uVar16 + 1;
          uVar15 = this->StackPosition;
        } while (uVar16 <= uVar15);
        if (!bVar4) {
          this->LastErrorState =
               this->pStack[uVar15].super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
               State;
          PrintStack(this,&this->ErrorStackStr);
LAB_0013f3a8:
          CleanupParseStack(this,0);
          return false;
        }
        if (this->pValidTokenStackPositions[(this->Token).super_TokenCode.Code] !=
            0xffffffffffffffff) {
          __assert_fail("pValidTokenStackPositions[Token.Code] == InvalidIndex",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                        ,0x294,
                        "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                       );
        }
        TVar10 = *token;
        local_60 = TVar10;
        do {
          if (TVar10.super_TokenCode.Code.Code == 0) {
            uVar11 = (this->Stream).ThisPos;
            if (0x1ff < uVar11) goto LAB_0013f3eb;
            if (uVar11 + ((this->Stream).pThisBlock)->Index <= this->PrevTokenIndex)
            goto LAB_0013f3a8;
          }
          else if (TVar10.super_TokenCode.Code.Code == 1) goto LAB_0013f3a8;
          BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetNextToken
                    (this_00,&local_60);
          TVar10 = (TokenType)((ulong)local_60 & 0xffffffff);
        } while (this->pValidTokenStackPositions[(long)TVar10] == 0xffffffffffffffff);
        uVar5 = ParseTable::GetAction
                          (this->pParseTable,
                           this->pStack[this->StackPosition].
                           super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State,
                           local_34.Code);
        if ((uVar5 >> 0xe & 1) == 0) {
          sVar9 = this->pValidTokenStackPositions[(ulong)local_60 & 0xffffffff];
LAB_0013f1bd:
          CleanupParseStack(this,sVar9);
        }
LAB_0013f1c2:
        uVar11 = (this->Stream).ThisPos;
        if (0x1ff < uVar11) goto LAB_0013f3eb;
        this->PrevTokenIndex = uVar11 + ((this->Stream).pThisBlock)->Index;
        BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekBack(this_00,1);
        (this->Token).super_TokenCode.Code = local_34.Code;
      }
      else {
        if (uVar5 == 0x4fff) {
          return true;
        }
        uVar11 = (ulong)(uVar5 & 0x3fff);
        pPVar12 = this->pParseTable;
        pRVar2 = (pPVar12->ReduceProductions).
                 super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pPVar12->ReduceProductions).
                          super__Vector_base<SGParser::ParseTable::ReduceProduction,_std::allocator<SGParser::ParseTable::ReduceProduction>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2 >> 2) <= uVar11)
        {
          __assert_fail("prodId < ReduceProductions.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./ParseTable.h"
                        ,0x97,
                        "ReduceProduction SGParser::ParseTable::GetReduceProduction(unsigned int) const"
                       );
        }
        RVar1 = pRVar2[uVar11];
        uVar15 = (ulong)RVar1._0_1_;
        if (uVar15 != 0) {
          lVar13 = 0;
          do {
            sVar9 = this->pStack[this->StackPosition + lVar13].
                    super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker;
            if (sVar9 != 0xffffffffffffffff) {
              BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::ReleaseMarker
                        (this_00,sVar9);
            }
            lVar13 = lVar13 + -1;
          } while (-lVar13 != uVar15);
          pPVar12 = this->pParseTable;
        }
        lVar13 = this->StackPosition - uVar15;
        this->StackPosition = lVar13 + 1;
        left = (uint)RVar1 >> 8 & 0x3fffff;
        uVar6 = ParseTable::GetLeftReduceState
                          (pPVar12,this->pStack[lVar13].
                                   super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                                   State,left);
        this->TopState = uVar6;
        if (uVar6 != 0xffffffff) {
          this->NextTokenFlag = false;
          this->ReduceLeft = left;
          if (((uint)RVar1 & 0xff) == 0) {
            if (((byte)(this->pParseTable->StateInfos).
                       super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar6] & 1) == 0) {
              this->pStack[this->StackPosition].
              super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker =
                   0xffffffffffffffff;
            }
            else {
              uVar15 = (this->Stream).ThisPos;
              if (0x1ff < uVar15) goto LAB_0013f3eb;
              sVar9 = uVar15 + ((this->Stream).pThisBlock)->Index;
              this->pStack[this->StackPosition].
              super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker = sVar9
              ;
              BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker
                        (this_00,sVar9);
            }
          }
          if ((((uint)RVar1 >> 0x1e & 1) == 0) &&
             (iVar7 = (*parseHandler->_vptr_ParseHandler[2])(parseHandler,this,uVar11),
             (char)iVar7 == '\0')) goto LAB_0013f3a8;
          if ((int)RVar1 < 0) {
            local_34.Code = this->ReduceLeft << 0x10 | uVar5 & 0x3fff;
            cVar8 = std::
                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&(this->pParseTable->ProductionErrorTerminals)._M_h,&local_34.Code);
            if (cVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                _M_cur != (__node_type *)0x0) {
              uVar6 = *(uint *)((long)cVar8.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                      ._M_cur + 0xc) & 0xfffffff;
              goto LAB_0013ef01;
            }
          }
          uVar5 = this->TopState;
          if (uVar5 == 0xffffffff) {
            return false;
          }
          goto LAB_0013ec87;
        }
        if (this->StackPosition == 0) {
          __assert_fail("StackPosition > 0u",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                        ,0x202,
                        "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                       );
        }
        this->StackPosition = this->StackPosition - 1;
        (this->Token).super_TokenCode.Code = 0;
        uVar11 = (this->Stream).ThisPos;
        if (0x1ff < uVar11) goto LAB_0013f3eb;
        this->PrevTokenIndex = uVar11 + ((this->Stream).pThisBlock)->Index;
        BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekBack(this_00,1);
      }
    }
    uVar11 = this->StackPosition + 1;
    this->StackPosition = uVar11;
    if (this->StackSize <= uVar11) {
      __assert_fail("StackPosition < StackSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./Parser.h"
                    ,0x1c8,
                    "bool SGParser::Parse<SGParser::Generator::RegExprNFAParseElement>::DoParse(ParseHandler<StackElement> &)"
                   );
    }
    pRVar3 = this->pStack;
    pRVar3[uVar11].super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State =
         uVar5 & 0x3fff;
    Generator::RegExprNFAParseElement::ShiftToken
              (pRVar3 + uVar11,token,
               &this_00->super_TokenStream<SGParser::Generator::RegExprParseToken>);
    pPVar12 = this->pParseTable;
    uVar5 = (this->Token).super_TokenCode.Code;
    if (((byte)(pPVar12->Terminals).
               super__Vector_base<SGParser::ParseTable::Terminal,_std::allocator<SGParser::ParseTable::Terminal>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5] & 1) != 0) {
      uVar11 = (this->Stream).ThisPos;
      if (0x1ff < uVar11) goto LAB_0013f3eb;
      TVar10 = (TokenType)
               &this->pStack[this->StackPosition - 1].
                super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker;
      if (uVar5 == 0) {
        TVar10 = tmpToken;
      }
      sVar9 = *(size_t *)TVar10;
      sVar14 = ((this->Stream).pThisBlock)->Index;
      streamLength = BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::
                     GetBufferedLength(this_00,sVar9);
      BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackToMarker
                (this_00,sVar9,streamLength);
      if (((byte)(this->pParseTable->StateInfos).
                 super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [this->pStack[this->StackPosition].
                  super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State] & 2) == 0)
      {
        BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SeekTo
                  (this_00,sVar14 + uVar11);
      }
      else {
        BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackToMarker
                  (this_00,this->pStack[this->StackPosition - 1].
                           super_ParseStackElement<SGParser::Generator::RegExprParseToken>.
                           TerminalMarker,0xffffffffffffffff);
      }
      (this->Stream).LengthLeft =
           -(ulong)((this->Stream).pSourceStream !=
                   (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0);
      pPVar12 = this->pParseTable;
    }
    sVar9 = this->StackPosition;
    pRVar3 = this->pStack;
    if (((byte)(pPVar12->StateInfos).
               super__Vector_base<SGParser::ParseTable::StateInfo,_std::allocator<SGParser::ParseTable::StateInfo>_>
               ._M_impl.super__Vector_impl_data._M_start
               [pRVar3[sVar9].super_ParseStackElement<SGParser::Generator::RegExprParseToken>.State]
        & 1) == 0) {
      pRVar3[sVar9].super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker =
           0xffffffffffffffff;
      goto LAB_0013eca5;
    }
    uVar11 = (this->Stream).ThisPos;
    if (0x1ff < uVar11) {
LAB_0013f3eb:
      __assert_fail("ThisPos < StreamBlock::BufferSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/./BacktrackingTokenStream.h"
                    ,0xd2,
                    "size_t SGParser::BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::GetTokenIndex() const [Token = SGParser::Generator::RegExprParseToken]"
                   );
    }
    sVar14 = uVar11 + ((this->Stream).pThisBlock)->Index;
    pRVar3[sVar9].super_ParseStackElement<SGParser::Generator::RegExprParseToken>.TerminalMarker =
         sVar14;
    BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::SetMarker(this_00,sVar14);
  } while( true );
}

Assistant:

bool Parse<StackElement>::DoParse(ParseHandler<StackElement>& parseHandler) {
    unsigned errorCode;

    // Continue to parse until we encounter an error or accept
    while (true) {
        // Check the top state to make sure it is valid
        if (TopState == InvalidState)
            return false;

        // Store result from the previous step
        pStack[StackPosition].State = TopState;

        // Get the token code if needed
        if (NextTokenFlag)
            GetNextToken(Token);

    try_next_action:
        // Keep shifting as long as 'Shift' action is selected
        auto actionEntry = pParseTable->GetAction(pStack[StackPosition].State, Token.Code);
        while (actionEntry & ParseTable::ShiftMask) {
            ++StackPosition;
            SG_ASSERT(StackPosition < StackSize);
            pStack[StackPosition].State = actionEntry & ParseTable::ExtractMask;

            // User callback (to get at token data)
            pStack[StackPosition].ShiftToken(Token, Stream);
            if (pParseTable->Terminals[Token.Code].ErrorTerminal) {
                const auto marker = Token.Code == TokenCode::TokenError
                                        ? ErrorMarker
                                        : pStack[StackPosition - 1u].TerminalMarker;
                const auto offset = Stream.GetTokenIndex();
                Stream.BacktrackToMarker(marker, Stream.GetBufferedLength(marker));
                pStack[StackPosition].SetErrorData(Token, Stream);
                // If it's a backtracking error, backtrack & retry the whole thing
                if (pParseTable->StateInfos[pStack[StackPosition].State].BacktrackOnError)
                    Stream.BacktrackToMarker(pStack[StackPosition - 1u].TerminalMarker);
                else
                    Stream.SeekTo(offset);
                Stream.SetMaxStreamLength();
            }

            // Start recording if needed
            if (pParseTable->StateInfos[pStack[StackPosition].State].Record)
                Stream.SetMarker(pStack[StackPosition].TerminalMarker = Stream.GetTokenIndex());
            else
                pStack[StackPosition].TerminalMarker = InvalidIndex;

            // Get next token
            GetNextToken(Token);
            // And get next action
            actionEntry = pParseTable->GetAction(pStack[StackPosition].State, Token.Code);
        }

        // Do Reduce
        if (actionEntry & ParseTable::ReduceMask) {
            // See if we have accepted
            if (actionEntry == ParseTable::AcceptValue)
                return true;

            // On reduce, this is the production Id
            const auto ReducedProd = actionEntry & ParseTable::ExtractMask;
            const auto rprod       = pParseTable->GetReduceProduction(ReducedProd);

            // Release all markers
            for (size_t i = 0u; i < size_t(rprod.Length); ++i)
                if (pStack[StackPosition - i].TerminalMarker != InvalidIndex)
                    Stream.ReleaseMarker(pStack[StackPosition - i].TerminalMarker);

            // Pop the production (size-1), (point to the top element
            // so it can be accessed with [])
            StackPosition = StackPosition + 1u - size_t(rprod.Length);
            // Get next state (consult goto)
            TopState      = pParseTable->GetLeftReduceState(pStack[StackPosition - 1u].State,
                                                            rprod.Left);
            if (TopState == InvalidState) {
                // Cleanup the stack, including [StackPosition].
                for (size_t i = size_t(rprod.Length + 1u); i > 0u; --i)
                    pStack[StackPosition + i - 1u].Cleanup();
                // Revert to previous stack position.
                SG_ASSERT(StackPosition > 0u);
                --StackPosition;
                // Set Token.Code to '%error', which will allow try_next_action to process
                // appropriately, with either shift or reduce.
                Token.Code     = TokenCode::TokenError;
                // Backtrack by one token so that the first valid token can be re-consumed
                // properly following an error.
                PrevTokenIndex = Stream.GetTokenIndex();
                Stream.SeekBack(1u);
                goto try_next_action;
            }
            NextTokenFlag = false;
            ReduceLeft    = rprod.Left;

            // If the Stack Position advanced we must make sure to set the terminal marker
            if (rprod.Length == 0u) {
                // Start recording if needed
                if (pParseTable->StateInfos[TopState].Record)
                    Stream.SetMarker(pStack[StackPosition].TerminalMarker =
                        Stream.GetTokenIndex());
                else
                    pStack[StackPosition].TerminalMarker = InvalidIndex;
            }

            // If the reduce function fails than return an error
            if (!rprod.NotReported && !parseHandler.Reduce(*this, ReducedProd))
                goto step_error;

            // Cleanup the stack after [StackPosition].
            // Leave the element at stack position unchanged since it holds the Reduce result.
            for (size_t i = size_t(rprod.Length); i > 0u; --i)
                pStack[StackPosition + i].Cleanup();

            // See if this production has to throw a named error
            if (rprod.ErrorTerminalFlag) {
                errorCode = ReducedProd | (ReduceLeft << 16u);
                if (const auto it = pParseTable->ProductionErrorTerminals.find(errorCode);
                    it != pParseTable->ProductionErrorTerminals.end()) {
                    errorCode = it->second;
                    errorCode &= ProductionMask::TerminalValue;
                    goto handle_error;
                }
            }
            continue;
        }

        // An Error has occurred, deal with it
        errorCode = TokenCode::TokenError;

    handle_error:
        // Note that if we haven't advanced input, it's the same error as before
        if (AdvancedInput() || Stream.GetBufferedLength(ErrorMarker) == 0u) {
            if (ErrorMarker != InvalidIndex)
                Stream.ReleaseMarker(ErrorMarker);
            ErrorMarker = Stream.GetTokenIndex() - 1u;
            Stream.SetMarker(ErrorMarker);
        }

        // Calculate valid token set
        bool       errorProdFound    = false;
        bool       nextActionValid   = false;
        size_t     nextStackPosition = 0u;
        const auto maxToken          = pParseTable->GetTerminalCount();
        std::fill(pValidTokenStackPositions, pValidTokenStackPositions + maxToken, InvalidIndex);

        // Search stack until a state with action on 'error' is found
        for (size_t i = 0u; i <= StackPosition; ++i) {
            const auto sp = StackPosition - i;
            actionEntry   = pParseTable->GetAction(pStack[sp].State, errorCode);
            if (actionEntry & (ParseTable::ShiftMask | ParseTable::ReduceMask)) {
                // If the action is reduce, we have to try reducing until we
                // finally shift the error token
                // Once we shift, we can look for the next valid token
                auto pos            = sp;
                auto actionVal      = actionEntry & ParseTable::ExtractMask;
                bool needNextAction = true;

                while (actionEntry & ParseTable::ReduceMask) {
                    // Check special case (Accept)
                    const auto length = pParseTable->GetReduceActionPopSize(actionVal);
                    if (length == 0u) {
                        needNextAction = false;
                        break;
                    }
                    pos -= length - 1u;
                    SG_ASSERT(pos > 0u && pos <= StackSize);
                    // Check special case (reduce state for action is invalid)
                    const auto state = pParseTable->GetReduceState(pStack[pos - 1u].State, actionVal);
                    if (state == InvalidState) {
                        needNextAction = false;
                        break;
                    }
                    actionEntry = pParseTable->GetAction(state, errorCode);
                    actionVal   = actionEntry & ParseTable::ExtractMask;
                }

                // We should be shifting next, so actionVal is a state that'll be
                // on stack once we shift error
                errorProdFound = true;

                if (needNextAction) {
                    const auto nextActionAfterError = pParseTable->GetAction(actionVal, Token.Code);
                    if ((nextActionAfterError & (ParseTable::ShiftMask | ParseTable::ReduceMask)) != 0) {
                        nextActionValid   = true;
                        nextStackPosition = sp;
                        break;
                    }
                }

                // Go through all symbols, and collect allowed tokens
                for (unsigned j = 0u; j < unsigned(maxToken); ++j)
                    if (pValidTokenStackPositions[j] == InvalidIndex)
                        if (pParseTable->GetAction(actionVal, j) & ParseTable::ActionMask)
                            pValidTokenStackPositions[j]  = sp;
            }
        }

        if (!errorProdFound) {
            LastErrorState = pStack[StackPosition].State;
            PrintStack(ErrorStackStr);
            goto step_error;
        }

        if (nextActionValid) {
            // If there are reductions we can do on 'error' lookahead, do them first
            if ((pParseTable->GetAction(pStack[StackPosition].State, errorCode) &
                 ParseTable::ReduceMask) == 0u) {
                // Flush the remainder of stack symbols (this will also set StackPosition=sp)
                CleanupParseStack(nextStackPosition);
            }
        } else {
            // If an error production was found up the stack, we try to recover. This involves:
            //  1. Skipping all tokens, potentially including the last token that triggered the error,
            //     until a valid token is found.
            //       - No tokens may be skipped at all if the offending token is actually valid directly
            //         after an error. If you wrote "(5 + )" instead of "(5 + 5)" your original error
            //         token may be ')' but it doesn't actually need to be skipped.
            //         In this case, pValidTokenStackPositions[Token.Code] is valid up the stack, so no skipping
            //         takes place.
            //  2. Rolling back the stack, which includes StackPosition to a state that accepts
            //     an error followed by our next token. This is done by
            //         CleanupParseStack(pValidTokenStackPositions[Token.Code])
            //  3. Backtracking by one token and setting Token.Code to 'errorCode' to continue parsing.
            //         This will cause '%error' to be shifted onto the stack and allow things
            //         to move on with the next valid token after it.
            // (1.) Skip all 'unacceptable' tokens until a valid token, if any.
            SG_ASSERT(pValidTokenStackPositions[Token.Code] == InvalidIndex);
            TokenType tmpToken = Token;
            do {
                if (tmpToken.Code == TokenCode::TokenEOF) {
                    // If EOF was not in a valid look-ahead following %error, and we have hit
                    // the end of file, there is nothing left to do.
                    goto step_error;
                }
                if (tmpToken.Code == TokenCode::TokenError) {
                    // There are two reasons we can end up here:
                    //   a) Tokenizer generated TokenError because it saw unexpected characters,
                    //      which it had no reg-exp for. If this is the case, just skip them.
                    //   b) This is a second time through the error-handling loop for the same token.
                    //      We've already set Token.Code = errorCode for this token and tried
                    //      to recover, but for some reason this didn't work and we are back here.
                    //      Fail if this is the case.
                    if (PrevTokenIndex >= Stream.GetTokenIndex())
                        goto step_error;
                }
                GetNextToken(tmpToken);
            } while (pValidTokenStackPositions[tmpToken.Code] == InvalidIndex);
            // If there are reductions we can do on 'error' lookahead, do them first
            if ((pParseTable->GetAction(pStack[StackPosition].State, errorCode) &
                 ParseTable::ReduceMask) == 0u) {
                // (2.) Flush the remainder of stack symbols (this will also set StackPosition=sp)
                CleanupParseStack(pValidTokenStackPositions[tmpToken.Code]);
            }
        }
        // Set Token.Code to '%error', which will allow try_next_action to process appropriately,
        // with either shift or reduce. Also backtrack by one token so that the first valid token
        // can be re-consumed properly following an error.
        PrevTokenIndex = Stream.GetTokenIndex();
        Stream.SeekBack(1u);
        Token.Code = errorCode;
        goto try_next_action;
    }

step_error:
    // Clean up the parse stack by freeing all the elements
    CleanupParseStack();
    return false;
}